

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O2

void __thiscall Fossilize::VulkanDevice::~VulkanDevice(VulkanDevice *this)

{
  pointer ppVVar1;
  VkSamplerYcbcrConversion_T **ycbcr;
  pointer ppVVar2;
  
  *(undefined ***)this = &PTR__VulkanDevice_002a1da0;
  ppVVar1 = (this->ycbcr_conversions).
            super__Vector_base<VkSamplerYcbcrConversion_T_*,_std::allocator<VkSamplerYcbcrConversion_T_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVVar2 = (this->ycbcr_conversions).
                 super__Vector_base<VkSamplerYcbcrConversion_T_*,_std::allocator<VkSamplerYcbcrConversion_T_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVVar2 != ppVVar1;
      ppVVar2 = ppVVar2 + 1) {
    (*vkDestroySamplerYcbcrConversionKHR)(this->device,*ppVVar2,(VkAllocationCallbacks *)0x0);
  }
  if ((this->is_null_device == false) && (this->device != (VkDevice)0x0)) {
    (*vkDestroyDevice)(this->device,(VkAllocationCallbacks *)0x0);
  }
  if (this->callback != (VkDebugReportCallbackEXT)0x0) {
    (*vkDestroyDebugReportCallbackEXT)(this->instance,this->callback,(VkAllocationCallbacks *)0x0);
  }
  if (this->instance != (VkInstance)0x0) {
    (*vkDestroyInstance)(this->instance,(VkAllocationCallbacks *)0x0);
  }
  std::_Vector_base<VkSamplerYcbcrConversion_T_*,_std::allocator<VkSamplerYcbcrConversion_T_*>_>::
  ~_Vector_base(&(this->ycbcr_conversions).
                 super__Vector_base<VkSamplerYcbcrConversion_T_*,_std::allocator<VkSamplerYcbcrConversion_T_*>_>
               );
  FeatureFilter::~FeatureFilter(&this->feature_filter);
  return;
}

Assistant:

VulkanDevice::~VulkanDevice()
{
	for (auto &ycbcr : ycbcr_conversions)
		vkDestroySamplerYcbcrConversionKHR(device, ycbcr, nullptr);
	if (!is_null_device && device)
		vkDestroyDevice(device, nullptr);
	if (callback)
		vkDestroyDebugReportCallbackEXT(instance, callback, nullptr);
	if (instance)
		vkDestroyInstance(instance, nullptr);
}